

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O2

void duckdb::ApproximateQuantileBindData::Serialize
               (Serializer *serializer,optional_ptr<duckdb::FunctionData,_true> bind_data_p,
               AggregateFunction *function)

{
  FunctionData *pFVar1;
  optional_ptr<duckdb::FunctionData,_true> bind_data_p_local;
  
  bind_data_p_local = bind_data_p;
  pFVar1 = optional_ptr<duckdb::FunctionData,_true>::operator->(&bind_data_p_local);
  Serializer::WriteProperty<duckdb::vector<float,true>>
            (serializer,100,"quantiles",(vector<float,_true> *)(pFVar1 + 1));
  return;
}

Assistant:

static void Serialize(Serializer &serializer, const optional_ptr<FunctionData> bind_data_p,
	                      const AggregateFunction &function) {
		auto &bind_data = bind_data_p->Cast<ApproximateQuantileBindData>();
		serializer.WriteProperty(100, "quantiles", bind_data.quantiles);
	}